

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

ProjectionLight * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::ProjectionLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,Transform *args,MediumHandle *args_1,Image *args_2
          ,RGBColorSpace **args_3,float *args_4,float *args_5,float *args_6,
          polymorphic_allocator<std::byte> *args_7)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x2d8,8);
  construct<pbrt::ProjectionLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (this,(ProjectionLight *)CONCAT44(extraout_var,iVar1),args,args_1,args_2,args_3,args_4,
             args_5,args_6,args_7);
  return (ProjectionLight *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }